

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cpp
# Opt level: O1

void ac::core::cpu::conv3x3_8to8_generic(Image *src,Image *dst,float *kernels,float *biases)

{
  int scale;
  int w;
  int local_50;
  int local_4c;
  anon_class_32_5_78cfb1ca local_48;
  undefined1 local_28 [40];
  
  local_48.w = src->w;
  local_48.h = src->h;
  local_48.step = src->pitch / (int)(uint)(byte)src->elementType;
  local_28._8_8_ = &local_48;
  local_4c = dst->w;
  local_28._0_8_ = &local_4c;
  local_50 = local_4c / local_48.w;
  local_28._24_8_ = &local_50;
  local_48.kernels = kernels;
  local_48.biases = biases;
  local_28._16_8_ = src;
  local_28._32_8_ = dst;
  core::
  parallelFor<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_include_AC_Core_Util_hpp:114:9)>
            (0,dst->h,(anon_class_40_5_2c6a907a *)local_28);
  return;
}

Assistant:

void conv3x3_8to8_generic(const Image& src, Image& dst, const float* kernels, const float* biases)
    {
        conv3x3_generic<float, float, 8, 8>(src, dst, kernels, biases);
    }